

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::Curiosity::Create
          (Curiosity *this,CuriosityChassisType chassis_type,CuriosityWheelType wheel_type)

{
  reference this_00;
  __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var1;
  element_type *peVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference this_01;
  shared_ptr<chrono::ChShaft> local_9f0;
  int local_9e0;
  undefined4 local_9dc;
  int i_1;
  shared_ptr<chrono::curiosity::CuriosityDifferentialLink> local_950;
  undefined4 local_93c;
  ChFrame<double> local_938;
  shared_ptr<chrono::curiosity::CuriosityDifferentialLink> local_8b0;
  ChFrame<double> local_8a0;
  shared_ptr<chrono::curiosity::CuriosityDifferentialBar> local_818;
  ChFrame<double> local_808;
  shared_ptr<chrono::curiosity::CuriosityUpright> local_780;
  ChFrame<double> local_770;
  shared_ptr<chrono::curiosity::CuriosityUpright> local_6e8;
  ChFrame<double> local_6d8;
  shared_ptr<chrono::curiosity::CuriosityUpright> local_650;
  ChFrame<double> local_640;
  shared_ptr<chrono::curiosity::CuriosityUpright> local_5b8;
  ChVector<double> local_5a8;
  undefined1 local_590 [8];
  ChQuaternion<double> steer_rot;
  ChFrame<double> local_568;
  shared_ptr<chrono::curiosity::CuriosityBogie> local_4e0;
  undefined4 local_4cc;
  ChFrame<double> local_4c8;
  shared_ptr<chrono::curiosity::CuriosityBogie> local_440;
  undefined4 local_42c;
  ChFrame<double> local_428;
  shared_ptr<chrono::curiosity::CuriosityRocker> local_3a0;
  undefined4 local_38c;
  ChFrame<double> local_388;
  shared_ptr<chrono::curiosity::CuriosityRocker> local_300;
  ChQuaternion<double> local_2f0;
  ChFrame<double> local_2d0;
  ChQuaternion<double> local_248;
  ChFrame<double> local_228;
  ChQuaternion<double> local_1a0;
  ChFrame<double> local_180;
  ChFrame<double> local_e8;
  shared_ptr<chrono::curiosity::CuriosityWheel> local_60;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  undefined1 local_38 [8];
  ChQuaternion<double> body_rot;
  CuriosityWheelType wheel_type_local;
  CuriosityChassisType chassis_type_local;
  Curiosity *this_local;
  
  body_rot.m_data[3]._0_4_ = wheel_type;
  body_rot.m_data[3]._4_4_ = chassis_type;
  ChQuaternion<double>::ChQuaternion((ChQuaternion<double> *)local_38);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityChassis,_const_char_(&)[8],_chrono::curiosity::CuriosityChassisType_&,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [8])local_48,(CuriosityChassisType *)0x2a378c,
             (shared_ptr<chrono::ChMaterialSurface> *)((long)body_rot.m_data + 0x1c));
  std::shared_ptr<chrono::curiosity::CuriosityChassis>::operator=
            (&this->m_chassis,(shared_ptr<chrono::curiosity::CuriosityChassis> *)local_48);
  std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr
            ((shared_ptr<chrono::curiosity::CuriosityChassis> *)local_48);
  for (local_4c = 0; local_4c < 6; local_4c = local_4c + 1) {
    ChFrame<double>::ChFrame
              (&local_e8,(ChVector<double> *)(wheel_pos + (long)local_4c * 0x18),
               (ChQuaternion<double> *)&QUNIT);
    chrono_types::
    make_shared<chrono::curiosity::CuriosityWheel,_const_char_(&)[6],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_chrono::curiosity::CuriosityWheelType_&,_0>
              ((char (*) [6])&local_60,(ChFrame<double> *)0x2a37be,
               (shared_ptr<chrono::ChMaterialSurface> *)&local_e8,
               (CuriosityWheelType *)&this->m_wheel_material);
    this_00 = std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                        (&this->m_wheels,(long)local_4c);
    std::shared_ptr<chrono::curiosity::CuriosityWheel>::operator=(this_00,&local_60);
    std::shared_ptr<chrono::curiosity::CuriosityWheel>::~shared_ptr(&local_60);
    ChFrame<double>::~ChFrame(&local_e8);
  }
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_180,(ChVector<double> *)&VNULL,&local_1a0);
  p_Var1 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                        (&this->m_wheels,1);
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  ChFrame<double>::operator=(&(peVar2->super_CuriosityPart).m_mesh_xform,&local_180);
  ChFrame<double>::~ChFrame(&local_180);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_228,(ChVector<double> *)&VNULL,&local_248);
  p_Var1 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                        (&this->m_wheels,3);
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  ChFrame<double>::operator=(&(peVar2->super_CuriosityPart).m_mesh_xform,&local_228);
  ChFrame<double>::~ChFrame(&local_228);
  chrono::Q_from_AngZ(3.141592653589793);
  ChFrame<double>::ChFrame(&local_2d0,(ChVector<double> *)&VNULL,&local_2f0);
  p_Var1 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                        (&this->m_wheels,5);
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var1);
  ChFrame<double>::operator=(&(peVar2->super_CuriosityPart).m_mesh_xform,&local_2d0);
  ChFrame<double>::~ChFrame(&local_2d0);
  ChFrame<double>::ChFrame
            (&local_388,(ChVector<double> *)cr_rel_pos_lf,(ChQuaternion<double> *)&QUNIT);
  local_38c = 0;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityRocker,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [9])&local_300,(ChFrame<double> *)"rocker_L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_388,(int *)&this->m_default_material);
  pvVar3 = std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                     (&this->m_rockers,0);
  std::shared_ptr<chrono::curiosity::CuriosityRocker>::operator=(pvVar3,&local_300);
  std::shared_ptr<chrono::curiosity::CuriosityRocker>::~shared_ptr(&local_300);
  ChFrame<double>::~ChFrame(&local_388);
  ChFrame<double>::ChFrame
            (&local_428,(ChVector<double> *)cr_rel_pos_rf,(ChQuaternion<double> *)&QUNIT);
  local_42c = 1;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityRocker,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [9])&local_3a0,(ChFrame<double> *)"rocker_R",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_428,(int *)&this->m_default_material);
  pvVar3 = std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                     (&this->m_rockers,1);
  std::shared_ptr<chrono::curiosity::CuriosityRocker>::operator=(pvVar3,&local_3a0);
  std::shared_ptr<chrono::curiosity::CuriosityRocker>::~shared_ptr(&local_3a0);
  ChFrame<double>::~ChFrame(&local_428);
  ChFrame<double>::ChFrame
            (&local_4c8,(ChVector<double> *)cr_rel_pos_lb,(ChQuaternion<double> *)&QUNIT);
  local_4cc = 0;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityBogie,_const_char_(&)[8],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [8])&local_440,(ChFrame<double> *)"bogie_L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_4c8,(int *)&this->m_default_material);
  pvVar4 = std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                     (&this->m_bogies,0);
  std::shared_ptr<chrono::curiosity::CuriosityBogie>::operator=(pvVar4,&local_440);
  std::shared_ptr<chrono::curiosity::CuriosityBogie>::~shared_ptr(&local_440);
  ChFrame<double>::~ChFrame(&local_4c8);
  ChFrame<double>::ChFrame
            (&local_568,(ChVector<double> *)cr_rel_pos_rb,(ChQuaternion<double> *)&QUNIT);
  steer_rot.m_data[3]._4_4_ = 1;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityBogie,_const_char_(&)[8],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [8])&local_4e0,(ChFrame<double> *)"bogie_R",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_568,(int *)&this->m_default_material);
  pvVar4 = std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                     (&this->m_bogies,1);
  std::shared_ptr<chrono::curiosity::CuriosityBogie>::operator=(pvVar4,&local_4e0);
  std::shared_ptr<chrono::curiosity::CuriosityBogie>::~shared_ptr(&local_4e0);
  ChFrame<double>::~ChFrame(&local_568);
  ChVector<double>::ChVector(&local_5a8,0.0,0.0,3.141592653589793);
  chrono::Q_from_Euler123(local_590);
  ChFrame<double>::ChFrame
            (&local_640,(ChVector<double> *)sr_rel_pos_lf,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityUpright,_const_char_(&)[11],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [11])&local_5b8,(ChFrame<double> *)"upright_FL",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_640);
  pvVar5 = std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                     (&this->m_rocker_uprights,0);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::operator=(pvVar5,&local_5b8);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::~shared_ptr(&local_5b8);
  ChFrame<double>::~ChFrame(&local_640);
  ChFrame<double>::ChFrame
            (&local_6d8,(ChVector<double> *)sr_rel_pos_rf,(ChQuaternion<double> *)local_590);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityUpright,_const_char_(&)[11],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [11])&local_650,(ChFrame<double> *)"upright_FR",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_6d8);
  pvVar5 = std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                     (&this->m_rocker_uprights,1);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::operator=(pvVar5,&local_650);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::~shared_ptr(&local_650);
  ChFrame<double>::~ChFrame(&local_6d8);
  ChFrame<double>::ChFrame
            (&local_770,(ChVector<double> *)sr_rel_pos_lb,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityUpright,_const_char_(&)[11],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [11])&local_6e8,(ChFrame<double> *)"upright_RL",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_770);
  pvVar5 = std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                     (&this->m_bogie_uprights,0);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::operator=(pvVar5,&local_6e8);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::~shared_ptr(&local_6e8);
  ChFrame<double>::~ChFrame(&local_770);
  ChFrame<double>::ChFrame
            (&local_808,(ChVector<double> *)sr_rel_pos_rb,(ChQuaternion<double> *)local_590);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityUpright,_const_char_(&)[11],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [11])&local_780,(ChFrame<double> *)"upright_RR",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_808);
  pvVar5 = std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                     (&this->m_bogie_uprights,1);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::operator=(pvVar5,&local_780);
  std::shared_ptr<chrono::curiosity::CuriosityUpright>::~shared_ptr(&local_780);
  ChFrame<double>::~ChFrame(&local_808);
  ChFrame<double>::ChFrame
            (&local_8a0,(ChVector<double> *)tr_rel_pos_t,(ChQuaternion<double> *)&QUNIT);
  chrono_types::
  make_shared<chrono::curiosity::CuriosityDifferentialBar,_const_char_(&)[9],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_0>
            ((char (*) [9])&local_818,(ChFrame<double> *)"diff bar",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_8a0);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialBar>::operator=
            (&this->m_diff_bar,&local_818);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialBar>::~shared_ptr(&local_818);
  ChFrame<double>::~ChFrame(&local_8a0);
  ChFrame<double>::ChFrame
            (&local_938,(ChVector<double> *)tr_rel_pos_l,(ChQuaternion<double> *)&QUNIT);
  local_93c = 0;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityDifferentialLink,_const_char_(&)[12],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [12])&local_8b0,(ChFrame<double> *)"diff link L",
             (shared_ptr<chrono::ChMaterialSurface> *)&local_938,(int *)&this->m_default_material);
  pvVar6 = std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
           operator[](&this->m_diff_links,0);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>::operator=(pvVar6,&local_8b0);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>::~shared_ptr(&local_8b0);
  ChFrame<double>::~ChFrame(&local_938);
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)&i_1,(ChVector<double> *)tr_rel_pos_r,(ChQuaternion<double> *)&QUNIT
            );
  local_9dc = 1;
  chrono_types::
  make_shared<chrono::curiosity::CuriosityDifferentialLink,_const_char_(&)[12],_chrono::ChFrame<double>,_std::shared_ptr<chrono::ChMaterialSurface>_&,_int,_0>
            ((char (*) [12])&local_950,(ChFrame<double> *)"diff link R",
             (shared_ptr<chrono::ChMaterialSurface> *)&i_1,(int *)&this->m_default_material);
  pvVar6 = std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
           operator[](&this->m_diff_links,1);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>::operator=(pvVar6,&local_950);
  std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>::~shared_ptr(&local_950);
  ChFrame<double>::~ChFrame((ChFrame<double> *)&i_1);
  for (local_9e0 = 0; local_9e0 < 6; local_9e0 = local_9e0 + 1) {
    chrono_types::make_shared<chrono::ChShaft,_0>();
    this_01 = std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                        (&this->m_drive_shafts,(long)local_9e0);
    std::shared_ptr<chrono::ChShaft>::operator=(this_01,&local_9f0);
    std::shared_ptr<chrono::ChShaft>::~shared_ptr(&local_9f0);
  }
  return;
}

Assistant:

void Curiosity::Create(CuriosityChassisType chassis_type, CuriosityWheelType wheel_type) {
    // create rover chassis
    ChQuaternion<> body_rot;
    m_chassis = chrono_types::make_shared<CuriosityChassis>("chassis", chassis_type, m_default_material);

    // Create 6 Curiosity Rover wheels
    for (int i = 0; i < 6; i++) {
        m_wheels[i] = chrono_types::make_shared<CuriosityWheel>("wheel", ChFrame<>(wheel_pos[i], QUNIT),
                                                                m_wheel_material, wheel_type);
    }
    m_wheels[C_RF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RM]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // Create Curiosity suspension rockers and bogies
    m_rockers[0] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_L", ChFrame<>(cr_rel_pos_lf, QUNIT), m_default_material, 0);
    m_rockers[1] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_R", ChFrame<>(cr_rel_pos_rf, QUNIT), m_default_material, 1);

    m_bogies[0] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_L", ChFrame<>(cr_rel_pos_lb, QUNIT), m_default_material, 0);
    m_bogies[1] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_R", ChFrame<>(cr_rel_pos_rb, QUNIT), m_default_material, 1);

    // Create the steering uprights
    ChQuaternion<> steer_rot = Q_from_Euler123(ChVector<double>(0, 0, CH_C_PI));

    m_rocker_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FL", ChFrame<>(sr_rel_pos_lf, QUNIT), m_default_material);
    m_rocker_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FR", ChFrame<>(sr_rel_pos_rf, steer_rot), m_default_material);

    m_bogie_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RL", ChFrame<>(sr_rel_pos_lb, QUNIT), m_default_material);
    m_bogie_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RR", ChFrame<>(sr_rel_pos_rb, steer_rot), m_default_material);

    // Create the differential components
    m_diff_bar = chrono_types::make_shared<CuriosityDifferentialBar>(  //
        "diff bar", ChFrame<>(tr_rel_pos_t, QUNIT), m_default_material);
    m_diff_links[0] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link L", ChFrame<>(tr_rel_pos_l, QUNIT), m_default_material, 0);
    m_diff_links[1] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link R", ChFrame<>(tr_rel_pos_r, QUNIT), m_default_material, 1);

    // Create drive shafts
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}